

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase77::run(TestCase77 *this)

{
  Reader reader;
  Builder builder_00;
  Reader reader_00;
  Builder builder_01;
  Reader reader_01;
  Reader reader_02;
  SegmentBuilder *pSVar1;
  Builder root;
  MallocMessageBuilder builder;
  SegmentBuilder *local_1e0;
  StructBuilder SStack_1d8;
  SegmentBuilder *local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  SegmentBuilder *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  Builder local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_140,&local_108.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_1e0,
             (EVP_PKEY_CTX *)(schemas::s_eb3f9ebe98c73cb6 + 0x48));
  pSVar1 = local_1e0;
  StructBuilder::asReader(&SStack_1d8);
  local_140.builder.segment = pSVar1;
  Schema::requireUsableAs((Schema *)&local_140,(RawSchema *)schemas::s_eb3f9ebe98c73cb6);
  reader._reader.capTable = (CapTableReader *)local_140.builder.pointer;
  reader._reader.segment = (SegmentReader *)local_140.builder.capTable;
  reader._reader.data = (void *)local_128;
  reader._reader.pointers = (WirePointer *)uStack_120;
  reader._reader.dataSize = (undefined4)local_118;
  reader._reader.pointerCount = local_118._4_2_;
  reader._reader._38_2_ = local_118._6_2_;
  reader._reader._40_8_ = uStack_110;
  checkTestMessage(reader);
  pSVar1 = local_1e0;
  StructBuilder::asReader(&SStack_1d8);
  local_178 = pSVar1;
  reader_01.reader.segment = (SegmentReader *)uStack_170;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)pSVar1;
  reader_01.reader.capTable = (CapTableReader *)local_168;
  reader_01.reader.data = (void *)uStack_160;
  reader_01.reader.pointers = (WirePointer *)local_158;
  reader_01.reader.dataSize = (undefined4)uStack_150;
  reader_01.reader.pointerCount = uStack_150._4_2_;
  reader_01.reader._38_2_ = uStack_150._6_2_;
  reader_01.reader._40_8_ = local_148;
  checkDynamicTestMessage(reader_01);
  builder_00.builder.segment = SStack_1d8.segment;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_1e0;
  builder_00.builder.capTable = SStack_1d8.capTable;
  builder_00.builder.data = SStack_1d8.data;
  builder_00.builder.pointers = SStack_1d8.pointers;
  builder_00.builder.dataSize = SStack_1d8.dataSize;
  builder_00.builder.pointerCount = SStack_1d8.pointerCount;
  builder_00.builder._38_2_ = SStack_1d8._38_2_;
  checkDynamicTestMessage(builder_00);
  pSVar1 = local_1e0;
  StructBuilder::asReader(&SStack_1d8);
  local_140.builder.segment = pSVar1;
  Schema::requireUsableAs((Schema *)&local_140,(RawSchema *)schemas::s_eb3f9ebe98c73cb6);
  reader_00._reader.capTable = (CapTableReader *)local_140.builder.pointer;
  reader_00._reader.segment = (SegmentReader *)local_140.builder.capTable;
  reader_00._reader.data = (void *)local_128;
  reader_00._reader.pointers = (WirePointer *)uStack_120;
  reader_00._reader.dataSize = (undefined4)local_118;
  reader_00._reader.pointerCount = local_118._4_2_;
  reader_00._reader._38_2_ = local_118._6_2_;
  reader_00._reader._40_8_ = uStack_110;
  checkTestMessage(reader_00);
  pSVar1 = local_1e0;
  StructBuilder::asReader(&SStack_1d8);
  local_1b0 = pSVar1;
  reader_02.reader.segment = (SegmentReader *)uStack_1a8;
  reader_02.schema.super_Schema.raw = (Schema)(Schema)pSVar1;
  reader_02.reader.capTable = (CapTableReader *)local_1a0;
  reader_02.reader.data = (void *)uStack_198;
  reader_02.reader.pointers = (WirePointer *)local_190;
  reader_02.reader.dataSize = (undefined4)uStack_188;
  reader_02.reader.pointerCount = uStack_188._4_2_;
  reader_02.reader._38_2_ = uStack_188._6_2_;
  reader_02.reader._40_8_ = local_180;
  checkDynamicTestMessage(reader_02);
  builder_01.builder.segment = SStack_1d8.segment;
  builder_01.schema.super_Schema.raw = (Schema)(Schema)local_1e0;
  builder_01.builder.capTable = SStack_1d8.capTable;
  builder_01.builder.data = SStack_1d8.data;
  builder_01.builder.pointers = SStack_1d8.pointers;
  builder_01.builder.dataSize = SStack_1d8.dataSize;
  builder_01.builder.pointerCount = SStack_1d8.pointerCount;
  builder_01.builder._38_2_ = SStack_1d8._38_2_;
  checkDynamicTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(SchemaLoader, LoadUnnamedUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestUnnamedUnion>().getProto()).asStruct();

  EXPECT_TRUE(schema.findFieldByName("") == nullptr);

  EXPECT_TRUE(schema.findFieldByName("foo") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("bar") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("before") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("after") != nullptr);
}